

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O0

char * ngx_http_upsync_set_lb(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  ngx_http_upsync_srv_conf_t *upscf;
  ngx_str_t *str;
  ngx_str_t *value;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  lVar1 = *(long *)(*(long *)((long)cf->ctx + 8) + ngx_http_upsync_module.ctx_index * 8);
  pvVar2 = cf->args->elts;
  if (*(long *)((long)pvVar2 + 0x10) == -1) {
    *(undefined8 *)(lVar1 + 0x28) = 0;
  }
  else {
    lVar3 = *(long *)((long)pvVar2 + 0x10);
    if (lVar3 == 7) {
      iVar4 = memcmp(*(void **)((long)pvVar2 + 0x18),"ip_hash",7);
      if (iVar4 == 0) {
        *(undefined8 *)(lVar1 + 0x28) = 2;
      }
    }
    else if (lVar3 == 10) {
      iVar4 = memcmp(*(void **)((long)pvVar2 + 0x18),"roundrobin",10);
      if (iVar4 == 0) {
        *(undefined8 *)(lVar1 + 0x28) = 1;
      }
      else {
        iVar4 = memcmp(*(void **)((long)pvVar2 + 0x18),"least_conn",10);
        if (iVar4 == 0) {
          *(undefined8 *)(lVar1 + 0x28) = 4;
        }
      }
    }
    else if (lVar3 == 0xb) {
      iVar4 = memcmp(*(void **)((long)pvVar2 + 0x18),"hash_modula",0xb);
      if (iVar4 == 0) {
        *(undefined8 *)(lVar1 + 0x28) = 8;
      }
      else {
        iVar4 = memcmp(*(void **)((long)pvVar2 + 0x18),"hash_ketama",0xb);
        if (iVar4 == 0) {
          *(undefined8 *)(lVar1 + 0x28) = 0x10;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_upsync_set_lb(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_str_t                         *value, *str;
    ngx_http_upsync_srv_conf_t        *upscf;

    upscf = ngx_http_conf_get_module_srv_conf(cf,
                                              ngx_http_upsync_module);
    value = cf->args->elts;

    str = &value[1];
    if (str->len == NGX_CONF_UNSET_SIZE) {
        upscf->upsync_lb = NGX_HTTP_LB_DEFAULT;

        return NGX_CONF_OK; 
    }

    switch(str->len) {
        case 7:
            if (ngx_memcmp((char *)str->data, "ip_hash", 7) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_IP_HASH;

                return NGX_CONF_OK;
            }

            break;

        case 10:
            if (ngx_memcmp((char *)str->data, "roundrobin", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_ROUNDROBIN;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "least_conn", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_LEAST_CONN;

                return NGX_CONF_OK;
            }

            break;

        case 11:
            if (ngx_memcmp((char *)str->data, "hash_modula", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_MODULA;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "hash_ketama", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_KETAMA;

                return NGX_CONF_OK;
            }

            break;
    }

    return NGX_CONF_OK;
}